

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O0

void * OPENSSL_sk_delete(OPENSSL_STACK *sk,size_t where)

{
  void *ret;
  size_t where_local;
  OPENSSL_STACK *sk_local;
  
  if ((sk == (OPENSSL_STACK *)0x0) || (sk->num <= where)) {
    sk_local = (OPENSSL_STACK *)0x0;
  }
  else {
    sk_local = (OPENSSL_STACK *)sk->data[where];
    if (where != sk->num - 1) {
      OPENSSL_memmove(sk->data + where,sk->data + where + 1,((sk->num - where) + -1) * 8);
    }
    sk->num = sk->num - 1;
  }
  return sk_local;
}

Assistant:

void *OPENSSL_sk_delete(OPENSSL_STACK *sk, size_t where) {
  void *ret;

  if (!sk || where >= sk->num) {
    return NULL;
  }

  ret = sk->data[where];

  if (where != sk->num - 1) {
    OPENSSL_memmove(&sk->data[where], &sk->data[where + 1],
                    sizeof(void *) * (sk->num - where - 1));
  }

  sk->num--;
  return ret;
}